

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar;
  bool bVar1;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = GImGui->CurrentTabBar;
    if (tab_bar == (ImGuiTabBar *)0x0) {
      __assert_fail("tab_bar && \"Needs to be called between BeginTabBar() and EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                    ,0x1a17,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    bVar1 = TabItemEx(tab_bar,label,p_open,flags);
    if ((char)((flags & 8U) >> 3) == '\0' && bVar1) {
      if ((tab_bar->Tabs).Size <= (int)tab_bar->LastTabItemIdx) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
      }
      PushOverrideID((tab_bar->Tabs).Data[(int)tab_bar->LastTabItemIdx].ID);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false; // FIXME-ERRORHANDLING
    }
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}